

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kinsol.c
# Opt level: O0

void * KINCreate(void)

{
  double dVar1;
  realtype rVar2;
  realtype uround;
  KINMem kin_mem;
  
  kin_mem = (KINMem)malloc(0x280);
  if (kin_mem == (KINMem)0x0) {
    KINProcessError((KINMem)0x0,0,"KINSOL","KINCreate","A memory request failed.");
    kin_mem = (KINMem)0x0;
  }
  else {
    memset(kin_mem,0,0x280);
    kin_mem->kin_uround = 2.220446049250313e-16;
    kin_mem->kin_func = (KINSysFn)0x0;
    kin_mem->kin_user_data = (void *)0x0;
    kin_mem->kin_constraints = (N_Vector)0x0;
    kin_mem->kin_uscale = (N_Vector)0x0;
    kin_mem->kin_fscale = (N_Vector)0x0;
    kin_mem->kin_fold_aa = (N_Vector)0x0;
    kin_mem->kin_gold_aa = (N_Vector)0x0;
    kin_mem->kin_df_aa = (N_Vector *)0x0;
    kin_mem->kin_dg_aa = (N_Vector *)0x0;
    kin_mem->kin_q_aa = (N_Vector *)0x0;
    kin_mem->kin_gamma_aa = (realtype *)0x0;
    kin_mem->kin_R_aa = (realtype *)0x0;
    kin_mem->kin_cv = (realtype *)0x0;
    kin_mem->kin_Xv = (N_Vector *)0x0;
    kin_mem->kin_m_aa = 0;
    kin_mem->kin_aamem_aa = 0;
    kin_mem->kin_setstop_aa = 0;
    kin_mem->kin_constraintsSet = 0;
    kin_mem->kin_ehfun = KINErrHandler;
    kin_mem->kin_eh_data = kin_mem;
    kin_mem->kin_errfp = _stderr;
    kin_mem->kin_ihfun = KINInfoHandler;
    kin_mem->kin_ih_data = kin_mem;
    kin_mem->kin_infofp = _stdout;
    kin_mem->kin_printfl = 0;
    kin_mem->kin_mxiter = 200;
    kin_mem->kin_noInitSetup = 0;
    kin_mem->kin_msbset = 10;
    kin_mem->kin_noResMon = 0;
    kin_mem->kin_msbset_sub = 5;
    kin_mem->kin_update_fnorm_sub = 0;
    kin_mem->kin_mxnbcf = 10;
    kin_mem->kin_sthrsh = 2.0;
    kin_mem->kin_noMinEps = 0;
    kin_mem->kin_mxnstepin = 0.0;
    dVar1 = sqrt(2.220446049250313e-16);
    kin_mem->kin_sqrt_relfunc = dVar1;
    rVar2 = SUNRpowerR(2.220446049250313e-16,0.6666666666666667);
    kin_mem->kin_scsteptol = rVar2;
    rVar2 = SUNRpowerR(2.220446049250313e-16,0.3333333333333333);
    kin_mem->kin_fnormtol = rVar2;
    kin_mem->kin_etaflag = 1;
    kin_mem->kin_eta = 0.1;
    kin_mem->kin_eta_alpha = 2.0;
    kin_mem->kin_eta_gamma = 0.9;
    kin_mem->kin_MallocDone = 0;
    kin_mem->kin_eval_omega = 1;
    kin_mem->kin_omega = 0.0;
    kin_mem->kin_omega_min = 1e-05;
    kin_mem->kin_omega_max = 0.9;
    kin_mem->kin_lrw = 0x11;
    kin_mem->kin_liw = 0x16;
    kin_mem->kin_lrw1 = 0;
    kin_mem->kin_liw1 = 0;
  }
  return kin_mem;
}

Assistant:

void *KINCreate(void)
{
  KINMem kin_mem;
  realtype uround;
 
  kin_mem = NULL;
  kin_mem = (KINMem) malloc(sizeof(struct KINMemRec));
  if (kin_mem == NULL) {
    KINProcessError(kin_mem, 0, "KINSOL", "KINCreate", MSG_MEM_FAIL);
    return(NULL);
  }

  /* Zero out kin_mem */
  memset(kin_mem, 0, sizeof(struct KINMemRec));

  /* set uround (unit roundoff) */

  kin_mem->kin_uround = uround = UNIT_ROUNDOFF;
  
  /* set default values for solver optional inputs */

  kin_mem->kin_func             = NULL;
  kin_mem->kin_user_data        = NULL;
  kin_mem->kin_constraints      = NULL;
  kin_mem->kin_uscale           = NULL;
  kin_mem->kin_fscale           = NULL;
  kin_mem->kin_fold_aa          = NULL;
  kin_mem->kin_gold_aa          = NULL;
  kin_mem->kin_df_aa            = NULL;
  kin_mem->kin_dg_aa            = NULL;
  kin_mem->kin_q_aa             = NULL;
  kin_mem->kin_gamma_aa         = NULL;
  kin_mem->kin_R_aa             = NULL;
  kin_mem->kin_cv               = NULL;
  kin_mem->kin_Xv               = NULL;
  kin_mem->kin_m_aa             = ZERO;
  kin_mem->kin_aamem_aa         = 0;
  kin_mem->kin_setstop_aa       = 0;
  kin_mem->kin_constraintsSet   = SUNFALSE;
  kin_mem->kin_ehfun            = KINErrHandler;
  kin_mem->kin_eh_data          = kin_mem;
  kin_mem->kin_errfp            = stderr;
  kin_mem->kin_ihfun            = KINInfoHandler;
  kin_mem->kin_ih_data          = kin_mem;
  kin_mem->kin_infofp           = stdout;
  kin_mem->kin_printfl          = PRINTFL_DEFAULT;
  kin_mem->kin_mxiter           = MXITER_DEFAULT;
  kin_mem->kin_noInitSetup      = SUNFALSE;
  kin_mem->kin_msbset           = MSBSET_DEFAULT;
  kin_mem->kin_noResMon         = SUNFALSE;
  kin_mem->kin_msbset_sub       = MSBSET_SUB_DEFAULT;
  kin_mem->kin_update_fnorm_sub = SUNFALSE;
  kin_mem->kin_mxnbcf           = MXNBCF_DEFAULT;
  kin_mem->kin_sthrsh           = TWO;
  kin_mem->kin_noMinEps         = SUNFALSE;
  kin_mem->kin_mxnstepin        = ZERO;
  kin_mem->kin_sqrt_relfunc     = SUNRsqrt(uround);
  kin_mem->kin_scsteptol        = SUNRpowerR(uround,TWOTHIRDS);
  kin_mem->kin_fnormtol         = SUNRpowerR(uround,ONETHIRD);
  kin_mem->kin_etaflag          = KIN_ETACHOICE1;
  kin_mem->kin_eta              = POINT1;     /* default for KIN_ETACONSTANT */
  kin_mem->kin_eta_alpha        = TWO;        /* default for KIN_ETACHOICE2  */
  kin_mem->kin_eta_gamma        = POINT9;     /* default for KIN_ETACHOICE2  */
  kin_mem->kin_MallocDone       = SUNFALSE;
  kin_mem->kin_eval_omega       = SUNTRUE;
  kin_mem->kin_omega            = ZERO;       /* default to using min/max    */
  kin_mem->kin_omega_min        = OMEGA_MIN;
  kin_mem->kin_omega_max        = OMEGA_MAX;

  /* initialize lrw and liw */

  kin_mem->kin_lrw = 17;
  kin_mem->kin_liw = 22;

  /* NOTE: needed since KINInit could be called after KINSetConstraints */

  kin_mem->kin_lrw1 = 0;
  kin_mem->kin_liw1 = 0;

  return((void *) kin_mem);
}